

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

void produceSpriteData(Image *img,bool size8x16,
                      vector<unsigned_char,_std::allocator<unsigned_char>_> *out)

{
  int iVar1;
  value_type local_69;
  iterator pvStack_68;
  uchar c;
  iterator __end2;
  iterator __begin2;
  array<unsigned_char,_16UL> *__range2;
  size_t tiles_y;
  size_t tiles_x;
  size_t iy;
  size_t ix;
  array<unsigned_char,_16UL> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  bool size8x16_local;
  Image *img_local;
  
  data._M_elems._8_8_ = out;
  iVar1 = cimg_library::CImg<unsigned_char>::width(img);
  tiles_y = (size_t)(iVar1 / 8);
  iVar1 = cimg_library::CImg<unsigned_char>::height(img);
  __range2 = (array<unsigned_char,_16UL> *)(long)(iVar1 / 8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)data._M_elems._8_8_);
  tiles_x = 0;
  iy = 0;
  while (iy < tiles_y && tiles_x < __range2) {
    imgtogb::convert(iy,tiles_x,img,(array<unsigned_char,_16UL> *)&ix);
    __begin2 = (iterator)&ix;
    __end2 = std::array<unsigned_char,_16UL>::begin((array<unsigned_char,_16UL> *)__begin2);
    pvStack_68 = std::array<unsigned_char,_16UL>::end((array<unsigned_char,_16UL> *)__begin2);
    for (; __end2 != pvStack_68; __end2 = __end2 + 1) {
      local_69 = *__end2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)data._M_elems._8_8_,
                 &local_69);
    }
    if (size8x16) {
      if ((tiles_x & 1) == 1) {
        if (iy == tiles_y - 1) {
          iy = 0;
        }
        else {
          tiles_x = tiles_x - 2;
          iy = iy + 1;
        }
      }
      tiles_x = tiles_x + 1;
    }
    else {
      iy = iy + 1;
      if (iy == tiles_y) {
        iy = 0;
        tiles_x = tiles_x + 1;
      }
    }
  }
  return;
}

Assistant:

void produceSpriteData(
	const Image &img,
	bool size8x16,
	std::vector<unsigned char> &out
) {
	std::array<unsigned char, 16> data;
	size_t ix, iy;

	size_t tiles_x = img.width() / 8;
	size_t tiles_y = img.height() / 8;

	out.clear();

	ix = iy = 0;
	while(ix < tiles_x && iy < tiles_y) {
		convert(ix, iy, img, data);
		for(unsigned char c : data) {
			out.push_back(c);
		}

		if(size8x16) {
			if(iy % 2 == 1) {
				if(ix == tiles_x-1) {
					ix = 0;
				} else {
					iy -= 2;
					ix++;
				}
			}
			iy++;
		} else {
			ix++;
			if(ix == tiles_x) {
				ix = 0;
				iy++;
			}
		}
	}
}